

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O3

idx_t duckdb::TemplatedMatch<true,duckdb::hugeint_t,duckdb::LessThan>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  data_ptr_t pdVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  value_type vVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  unsigned_long *puVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  const_reference pvVar11;
  idx_t iVar12;
  idx_t iVar13;
  idx_t iVar14;
  idx_t iVar15;
  hugeint_t *lhs_data;
  bool bVar16;
  idx_t local_58;
  
  if ((lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pSVar2 = (lhs_format->unified).sel;
    pdVar1 = (lhs_format->unified).data;
    pdVar3 = rhs_row_locations->data;
    pvVar11 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar4 = *pvVar11;
      iVar12 = *no_match_count;
      psVar5 = sel->sel_vector;
      psVar6 = pSVar2->sel_vector;
      local_58 = 0;
      iVar13 = 0;
      do {
        iVar14 = iVar13;
        if (psVar5 != (sel_t *)0x0) {
          iVar14 = (idx_t)psVar5[iVar13];
        }
        iVar15 = iVar14;
        if (psVar6 != (sel_t *)0x0) {
          iVar15 = (idx_t)psVar6[iVar14];
        }
        lVar8 = *(long *)(pdVar3 + iVar14 * 8);
        if ((1 << ((byte)col_idx & 7) & (uint)*(byte *)(lVar8 + (col_idx >> 3))) == 0) {
LAB_00ad5d35:
          *no_match_count = iVar12 + 1;
          no_match_sel->sel_vector[iVar12] = (sel_t)iVar14;
          iVar12 = iVar12 + 1;
        }
        else {
          lVar9 = *(long *)(lVar8 + 8 + vVar4);
          lVar10 = *(long *)(pdVar1 + iVar15 * 0x10 + 8);
          if ((lVar9 <= lVar10) &&
             (*(ulong *)(lVar8 + vVar4) <= *(ulong *)(pdVar1 + iVar15 * 0x10) || lVar9 != lVar10))
          goto LAB_00ad5d35;
          psVar5[local_58] = (sel_t)iVar14;
          local_58 = local_58 + 1;
        }
        iVar13 = iVar13 + 1;
        if (count == iVar13) {
          return local_58;
        }
      } while( true );
    }
  }
  else {
    pdVar1 = rhs_row_locations->data;
    pSVar2 = (lhs_format->unified).sel;
    pdVar3 = (lhs_format->unified).data;
    pvVar11 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar4 = *pvVar11;
      iVar12 = *no_match_count;
      psVar5 = sel->sel_vector;
      psVar6 = pSVar2->sel_vector;
      puVar7 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      local_58 = 0;
      iVar13 = 0;
      do {
        iVar14 = iVar13;
        if (psVar5 != (sel_t *)0x0) {
          iVar14 = (idx_t)psVar5[iVar13];
        }
        iVar15 = iVar14;
        if (psVar6 != (sel_t *)0x0) {
          iVar15 = (idx_t)psVar6[iVar14];
        }
        if (puVar7 == (unsigned_long *)0x0) {
          bVar16 = false;
        }
        else {
          bVar16 = (puVar7[iVar15 >> 6] >> (iVar15 & 0x3f) & 1) == 0;
        }
        if ((bVar16) ||
           (lVar8 = *(long *)(pdVar1 + iVar14 * 8),
           ((uint)*(byte *)(lVar8 + (col_idx >> 3)) & 1 << ((byte)col_idx & 7)) == 0)) {
LAB_00ad5c52:
          *no_match_count = iVar12 + 1;
          no_match_sel->sel_vector[iVar12] = (sel_t)iVar14;
          iVar12 = iVar12 + 1;
        }
        else {
          lVar9 = *(long *)(lVar8 + 8 + vVar4);
          lVar10 = *(long *)(pdVar3 + iVar15 * 0x10 + 8);
          if ((lVar9 <= lVar10) &&
             (*(ulong *)(lVar8 + vVar4) <= *(ulong *)(pdVar3 + iVar15 * 0x10) || lVar9 != lVar10))
          goto LAB_00ad5c52;
          psVar5[local_58] = (sel_t)iVar14;
          local_58 = local_58 + 1;
        }
        iVar13 = iVar13 + 1;
        if (count == iVar13) {
          return local_58;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}